

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O3

int rtosc_subpath_pat_type(char *pattern)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  byte *pbVar7;
  
  pcVar4 = strrchr(pattern,0x2a);
  pcVar5 = strchr(pattern,0x23);
  bVar1 = *pattern;
  if (bVar1 == 0) {
    bVar2 = false;
  }
  else {
    if ((bVar1 == 0x2a) && (pattern[1] == '\0')) {
      return 1;
    }
    pbVar7 = (byte *)(pattern + 1);
    bVar3 = true;
    do {
      bVar2 = false;
      if (((-1 < (char)bVar1) &&
          (((0x2f < bVar1 || ((0x800900000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
           (bVar2 = false, bVar1 != 0x7b)))) && (bVar1 != 0x7d)) {
        bVar2 = bVar3;
      }
      bVar1 = *pbVar7;
      pbVar7 = pbVar7 + 1;
      bVar3 = bVar2;
    } while (bVar1 != 0);
    bVar2 = !bVar2;
  }
  if ((bVar2) || (iVar6 = 2, pcVar4 != (char *)0x0)) {
    iVar6 = (uint)(pcVar5 != (char *)0x0) * 5 + 2;
  }
  return iVar6;
}

Assistant:

int rtosc_subpath_pat_type(const char *pattern)
{
    int charwise_only = 1;
    const char *last_star = strrchr(pattern, '*');
    const char *pound = strchr(pattern, '#');
    if(!strcmp("*", pattern))
        return RTOSC_MATCH_ALL;

    for(const char *p = pattern;*p;++p)
        charwise_only &= is_charwise(*p);
    if(charwise_only && !last_star)
        return RTOSC_MATCH_CHAR;
    if(pound)
        return RTOSC_MATCH_ENUMERATED;


    return 2;
}